

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::sparse_hashtable(sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this,MoveDontCopyT mover,
                  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_38;
  
  iVar9 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_
  ;
  iVar10 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
           num_hashes_;
  uVar1 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
            num_compares_;
  sVar2 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar3 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar12 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_;
  bVar4 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_
  ;
  bVar5 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_;
  bVar6 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_;
  uVar7 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.field_0x2b;
  uVar8 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
       fVar12;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       bVar4;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_ = bVar5;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = bVar6;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.field_0x2b = uVar7;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.num_ht_copies_ = uVar8
  ;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
       sVar2;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
       sVar3;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ =
       iVar9;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar10;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar1;
  iVar9 = (ht->key_info).super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_;
  (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar9;
  *(undefined8 *)&(this->key_info).super_Hasher.num_compares_ = uVar1;
  this->num_deleted = 0;
  local_38.id_ = (ht->table).settings.super_allocator_type.id_;
  local_38._4_4_ = *(undefined4 *)&(ht->table).settings.super_allocator_type.field_0x4;
  local_38.count_ = (ht->table).settings.super_allocator_type.count_;
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  sparsetable(&this->table,0,&local_38);
  fVar12 = (float)(this->table).settings.table_size;
  fVar13 = (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
           enlarge_factor_ * fVar12;
  uVar11 = (ulong)fVar13;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
       (long)(fVar13 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11;
  fVar12 = fVar12 * (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                    shrink_factor_;
  uVar11 = (ulong)fVar12;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
       (long)(fVar12 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       false;
  move_from(this,mover,ht,min_buckets_wanted);
  return;
}

Assistant:

sparse_hashtable(MoveDontCopyT mover, sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    move_from(mover, ht, min_buckets_wanted);  // ignores deleted entries
  }